

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

FArchive * __thiscall
FArchive::SerializePointer(FArchive *this,void *ptrbase,BYTE **ptr,DWORD elemSize)

{
  undefined8 in_RAX;
  ulong uVar1;
  DWORD count;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  int ofs;
  BYTE in;
  undefined8 uStack_38;
  
  if (this->m_Storing == true) {
    if (*ptr == (BYTE *)0x0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (ulong)((long)*ptr - (long)ptrbase) / (ulong)elemSize;
    }
    uVar3 = uVar1 & 0xffffffff;
    uStack_38 = in_RAX;
    do {
      uVar2 = (uint)uVar1;
      uStack_38._0_3_ = CONCAT12((0x7f < uVar2) << 7 | (byte)uVar1 & 0x7f,(undefined2)uStack_38);
      (*this->_vptr_FArchive[2])(this,(long)&uStack_38 + 2,1);
      uVar3 = uVar3 >> 7;
      uVar1 = uVar3;
    } while (0x7f < uVar2);
  }
  else {
    uStack_38 = CONCAT44(elemSize,(int)in_RAX);
    uVar2 = 0;
    bVar4 = 0;
    do {
      (*this->_vptr_FArchive[3])(this,(long)&uStack_38 + 3,1);
      uVar2 = uVar2 | (uStack_38._3_1_ & 0x7f) << (bVar4 & 0x1f);
      bVar4 = bVar4 + 7;
    } while ((char)uStack_38._3_1_ < '\0');
    if (uVar2 == 0xffffffff) {
      *ptr = (BYTE *)0x0;
    }
    else {
      *ptr = (BYTE *)((long)ptrbase + (ulong)(uVar2 * uStack_38._4_4_));
    }
  }
  return this;
}

Assistant:

FArchive &FArchive::SerializePointer (void *ptrbase, BYTE **ptr, DWORD elemSize)
{
	DWORD w;

	if (m_Storing)
	{
		if (*(void **)ptr)
		{
			w = DWORD(((size_t)*ptr - (size_t)ptrbase) / elemSize);
		}
		else
		{
			w = ~0u;
		}
		WriteCount (w);
	}
	else
	{
		w = ReadCount ();
		if (w != ~0u)
		{
			*(void **)ptr = (BYTE *)ptrbase + w * elemSize;
		}
		else
		{
			*(void **)ptr = NULL;
		}
	}
	return *this;
}